

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintUInt32
          (FieldValuePrinterWrapper *this,uint32_t val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_50 [32];
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  FieldValuePrinterWrapper *pFStack_10;
  uint32_t val_local;
  FieldValuePrinterWrapper *this_local;
  
  local_20 = generator;
  generator_local._4_4_ = val;
  pFStack_10 = this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[4])(local_50,pFVar1,(ulong)generator_local._4_4_);
  local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
  TextFormat::BaseTextGenerator::PrintString(generator,local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void PrintUInt32(uint32_t val,
                   TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintUInt32(val));
  }